

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,int value)

{
  uint32_t n;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  ostream_type *local_38;
  char *pcStack_30;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  internal::count_digits(n);
  if (value < 0) {
    local_48._M_stream._0_1_ = 0x2d;
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              (&this->out_,(char *)&local_48);
  }
  local_38 = (this->out_)._M_stream;
  pcStack_30 = (this->out_)._M_string;
  internal::
  format_decimal<char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_int>
            (&local_48,(uint)&local_38,n);
  (this->out_)._M_stream =
       (ostream_type *)CONCAT71(local_48._M_stream._1_7_,local_48._M_stream._0_1_);
  (this->out_)._M_string = local_48._M_string;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }